

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_parser.h
# Opt level: O0

void websocket_xmask(void *msg,uint64_t len,uint32_t mask)

{
  undefined1 uVar1;
  long lVar2;
  uint64_t xmask;
  uint64_t comb;
  uintptr_t offset;
  ulong uStack_18;
  uint32_t mask_local;
  uint64_t len_local;
  void *msg_local;
  
  len_local = (uint64_t)msg;
  uStack_18 = len;
  offset._4_4_ = mask;
  if (len < 8) goto LAB_00189397;
  lVar2 = -(ulong)((uint)msg & 3);
  comb = lVar2 + 4;
  if (comb == 1) {
LAB_001892ad:
    offset._4_1_ = (byte)mask;
    *(byte *)msg = *msg ^ offset._4_1_;
    xmask = CONCAT44(mask,mask);
    uVar1 = *(undefined1 *)((long)&xmask + lVar2 + 4);
    offset._4_4_ = CONCAT31((int3)(mask >> 8),uVar1);
    offset._6_2_ = (undefined2)(mask >> 0x10);
    offset._4_2_ = CONCAT11(*(undefined1 *)((long)&xmask + lVar2 + 5),uVar1);
    offset._7_1_ = (byte)(mask >> 0x18);
    offset._4_3_ = CONCAT12(*(undefined1 *)((long)&xmask + lVar2 + 6),offset._4_2_);
    offset._4_4_ = CONCAT13(*(undefined1 *)((long)&xmask + lVar2 + 7),offset._4_3_);
    len_local = (long)msg + comb;
    uStack_18 = len - comb;
  }
  else {
    if (comb == 2) {
LAB_0018929c:
      offset._5_1_ = (byte)(mask >> 8);
      *(byte *)((long)msg + 1) = *(byte *)((long)msg + 1) ^ offset._5_1_;
      goto LAB_001892ad;
    }
    if (comb == 3) {
      offset._6_1_ = (byte)(mask >> 0x10);
      *(byte *)((long)msg + 2) = *(byte *)((long)msg + 2) ^ offset._6_1_;
      goto LAB_0018929c;
    }
  }
  if ((len_local & 7) != 0) {
    *(uint32_t *)len_local = offset._4_4_ ^ *(uint *)len_local;
    uStack_18 = uStack_18 - 4;
    len_local = len_local + 4;
  }
  for (; 7 < uStack_18; uStack_18 = uStack_18 - 8) {
    *(ulong *)len_local = CONCAT44(offset._4_4_,offset._4_4_) ^ *(ulong *)len_local;
    len_local = len_local + 8;
  }
LAB_00189397:
  switch(uStack_18) {
  case 7:
    *(byte *)(len_local + 6) = *(byte *)(len_local + 6) ^ offset._6_1_;
  case 6:
    *(byte *)(len_local + 5) = *(byte *)(len_local + 5) ^ offset._5_1_;
  case 5:
    *(byte *)(len_local + 4) = *(byte *)(len_local + 4) ^ offset._4_1_;
  case 4:
    *(byte *)(len_local + 3) = *(byte *)(len_local + 3) ^ offset._7_1_;
  case 3:
    *(byte *)(len_local + 2) = *(byte *)(len_local + 2) ^ offset._6_1_;
  case 2:
    *(byte *)(len_local + 1) = *(byte *)(len_local + 1) ^ offset._5_1_;
  case 1:
    *(byte *)len_local = *(byte *)len_local ^ offset._4_1_;
    return;
  default:
    return;
  }
}

Assistant:

void websocket_xmask(void *msg, uint64_t len, uint32_t mask) {
  if (len > 7) {
    { /* XOR any unaligned memory (4 byte alignment) */
      const uintptr_t offset = 4 - ((uintptr_t)msg & 3);
      switch (offset) {
      case 3:
        ((uint8_t *)msg)[2] ^= ((uint8_t *)(&mask))[2];
      /* fallthrough */
      case 2:
        ((uint8_t *)msg)[1] ^= ((uint8_t *)(&mask))[1];
      /* fallthrough */
      case 1:
        ((uint8_t *)msg)[0] ^= ((uint8_t *)(&mask))[0];
        /* rotate mask and move pointer to first 4 byte alignment */
        uint64_t comb = mask | ((uint64_t)mask << 32);
        ((uint8_t *)(&mask))[0] = ((uint8_t *)(&comb))[0 + offset];
        ((uint8_t *)(&mask))[1] = ((uint8_t *)(&comb))[1 + offset];
        ((uint8_t *)(&mask))[2] = ((uint8_t *)(&comb))[2 + offset];
        ((uint8_t *)(&mask))[3] = ((uint8_t *)(&comb))[3 + offset];
        msg = (void *)((uintptr_t)msg + offset);
        len -= offset;
      }
    }
#if UINTPTR_MAX <= 0xFFFFFFFF
    /* handle  4 byte XOR alignment in 32 bit mnachine*/
    while (len >= 4) {
      *((uint32_t *)msg) ^= mask;
      len -= 4;
      msg = (void *)((uintptr_t)msg + 4);
    }
#else
    /* handle first 4 byte XOR alignment and move on to 64 bits */
    if ((uintptr_t)msg & 7) {
      *((uint32_t *)msg) ^= mask;
      len -= 4;
      msg = (void *)((uintptr_t)msg + 4);
    }
    /* intrinsic / XOR by 8 byte block, memory aligned */
    const uint64_t xmask = (((uint64_t)mask) << 32) | mask;
    while (len >= 8) {
      *((uint64_t *)msg) ^= xmask;
      len -= 8;
      msg = (void *)((uintptr_t)msg + 8);
    }
#endif
  }

  /* XOR any leftover bytes (might be non aligned)  */
  switch (len) {
  case 7:
    ((uint8_t *)msg)[6] ^= ((uint8_t *)(&mask))[2];
  /* fallthrough */
  case 6:
    ((uint8_t *)msg)[5] ^= ((uint8_t *)(&mask))[1];
  /* fallthrough */
  case 5:
    ((uint8_t *)msg)[4] ^= ((uint8_t *)(&mask))[0];
  /* fallthrough */
  case 4:
    ((uint8_t *)msg)[3] ^= ((uint8_t *)(&mask))[3];
  /* fallthrough */
  case 3:
    ((uint8_t *)msg)[2] ^= ((uint8_t *)(&mask))[2];
  /* fallthrough */
  case 2:
    ((uint8_t *)msg)[1] ^= ((uint8_t *)(&mask))[1];
  /* fallthrough */
  case 1:
    ((uint8_t *)msg)[0] ^= ((uint8_t *)(&mask))[0];
    /* fallthrough */
  }
}